

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitSIMDLoadStoreLane
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          SIMDLoadStoreLane *curr)

{
  Name memory;
  address64_t aVar1;
  char *curr_00;
  bool bVar2;
  Index bytes;
  int32_t iVar3;
  uint32_t init;
  uint uVar4;
  int iVar5;
  ExpressionRunner<wasm::ModuleRunner> *pEVar6;
  Address memorySize_00;
  Literal *pLVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  undefined4 extraout_var;
  ExternalInterface *pEVar11;
  reference pvVar12;
  int64_t iVar13;
  Literal local_580;
  undefined4 local_568;
  undefined4 uStack_564;
  undefined4 uStack_560;
  undefined4 uStack_55c;
  address64_t local_558;
  Literal local_550;
  undefined1 local_538 [8];
  array<wasm::Literal,_2UL> lanes_3;
  Literal local_4f0;
  undefined4 local_4d8;
  undefined4 uStack_4d4;
  undefined4 uStack_4d0;
  undefined4 uStack_4cc;
  address64_t local_4c8;
  Literal local_4c0;
  undefined1 local_4a8 [8];
  array<wasm::Literal,_4UL> lanes_2;
  Literal local_430;
  undefined4 local_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  address64_t local_408;
  Literal local_400;
  undefined1 local_3e8 [8];
  array<wasm::Literal,_8UL> lanes_1;
  Literal local_310;
  undefined4 local_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  address64_t local_2e8;
  Literal local_2e0;
  undefined1 local_2c8 [8];
  array<wasm::Literal,_16UL> lanes;
  Literal vec;
  Literal local_128;
  address64_t local_110;
  Address addr;
  Address memorySize;
  undefined1 local_d8 [8];
  MemoryInstanceInfo info;
  Flow vecFlow;
  undefined1 local_68 [8];
  Flow ptrFlow;
  SIMDLoadStoreLane *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  ptrFlow.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar6 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar6,
             *(Expression **)(ptrFlow.breakTo.super_IString.str._M_str + 0x30));
  bVar2 = Flow::breaking((Flow *)local_68);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar6 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&info.name.super_IString.str._M_str,pEVar6,
               *(Expression **)(ptrFlow.breakTo.super_IString.str._M_str + 0x38));
    bVar2 = Flow::breaking((Flow *)&info.name.super_IString.str._M_str);
    if (bVar2) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&info.name.super_IString.str._M_str);
    }
    else {
      getMemoryInstanceInfo
                ((MemoryInstanceInfo *)local_d8,this,
                 (Name)((IString *)(ptrFlow.breakTo.super_IString.str._M_str + 0x40))->str);
      memory.super_IString.str._M_len._4_4_ = info.instance._4_4_;
      memory.super_IString.str._M_len._0_4_ = info.instance._0_4_;
      memory.super_IString.str._M_str._4_4_ = info.name.super_IString.str._M_len._4_4_;
      memory.super_IString.str._M_str._0_4_ = (undefined4)info.name.super_IString.str._M_len;
      memorySize_00 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_d8,memory);
      curr_00 = ptrFlow.breakTo.super_IString.str._M_str;
      pLVar7 = Flow::getSingleValue((Flow *)local_68);
      ::wasm::Literal::Literal(&local_128,pLVar7);
      bytes = ::wasm::SIMDLoadStoreLane::getMemBytes();
      local_110 = (address64_t)
                  getFinalAddress<wasm::SIMDLoadStoreLane>
                            ((ModuleRunnerBase<wasm::ModuleRunner> *)local_d8,
                             (SIMDLoadStoreLane *)curr_00,&local_128,bytes,memorySize_00);
      ::wasm::Literal::~Literal(&local_128);
      pLVar7 = Flow::getSingleValue((Flow *)&info.name.super_IString.str._M_str);
      ::wasm::Literal::Literal((Literal *)&lanes._M_elems[0xf].type,pLVar7);
      switch(*(undefined4 *)(ptrFlow.breakTo.super_IString.str._M_str + 0x10)) {
      case 0:
      case 4:
        ::wasm::Literal::getLanesUI8x16();
        bVar2 = SIMDLoadStoreLane::isLoad
                          ((SIMDLoadStoreLane *)ptrFlow.breakTo.super_IString.str._M_str);
        if (bVar2) {
          pEVar11 = MemoryInstanceInfo::interface((MemoryInstanceInfo *)local_d8);
          local_2e8 = local_110;
          local_2f8 = info.instance._0_4_;
          uStack_2f4 = info.instance._4_4_;
          uStack_2f0 = (undefined4)info.name.super_IString.str._M_len;
          uStack_2ec = info.name.super_IString.str._M_len._4_4_;
          uVar4 = (*pEVar11->_vptr_ExternalInterface[0xe])
                            (pEVar11,local_110,CONCAT44(info.instance._4_4_,info.instance._0_4_),
                             CONCAT44(info.name.super_IString.str._M_len._4_4_,
                                      (undefined4)info.name.super_IString.str._M_len));
          wasm::Literal::Literal(&local_2e0,uVar4 & 0xff);
          pvVar8 = std::array<wasm::Literal,_16UL>::operator[]
                             ((array<wasm::Literal,_16UL> *)local_2c8,
                              (ulong)(byte)ptrFlow.breakTo.super_IString.str._M_str[0x28]);
          ::wasm::Literal::operator=(pvVar8,&local_2e0);
          ::wasm::Literal::~Literal(&local_2e0);
          ::wasm::Literal::Literal(&local_310,(array *)local_2c8);
          Flow::Flow(__return_storage_ptr__,&local_310);
          ::wasm::Literal::~Literal(&local_310);
        }
        else {
          pEVar11 = MemoryInstanceInfo::interface((MemoryInstanceInfo *)local_d8);
          aVar1 = local_110;
          pvVar8 = std::array<wasm::Literal,_16UL>::operator[]
                             ((array<wasm::Literal,_16UL> *)local_2c8,
                              (ulong)(byte)ptrFlow.breakTo.super_IString.str._M_str[0x28]);
          iVar3 = wasm::Literal::geti32(pvVar8);
          lanes_1._M_elems[7].type.id._0_4_ = info.instance._0_4_;
          lanes_1._M_elems[7].type.id._4_4_ = info.instance._4_4_;
          (*pEVar11->_vptr_ExternalInterface[0x16])
                    (pEVar11,aVar1,(ulong)(uint)(int)(char)iVar3,
                     CONCAT44(info.instance._4_4_,info.instance._0_4_),
                     CONCAT44(info.name.super_IString.str._M_len._4_4_,
                              (undefined4)info.name.super_IString.str._M_len));
          Flow::Flow(__return_storage_ptr__);
        }
        std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_2c8);
        break;
      case 1:
      case 5:
        ::wasm::Literal::getLanesUI16x8();
        bVar2 = SIMDLoadStoreLane::isLoad
                          ((SIMDLoadStoreLane *)ptrFlow.breakTo.super_IString.str._M_str);
        if (bVar2) {
          pEVar11 = MemoryInstanceInfo::interface((MemoryInstanceInfo *)local_d8);
          local_408 = local_110;
          local_418 = info.instance._0_4_;
          uStack_414 = info.instance._4_4_;
          uStack_410 = (undefined4)info.name.super_IString.str._M_len;
          uStack_40c = info.name.super_IString.str._M_len._4_4_;
          uVar4 = (*pEVar11->_vptr_ExternalInterface[0x10])
                            (pEVar11,local_110,CONCAT44(info.instance._4_4_,info.instance._0_4_),
                             CONCAT44(info.name.super_IString.str._M_len._4_4_,
                                      (undefined4)info.name.super_IString.str._M_len));
          wasm::Literal::Literal(&local_400,uVar4 & 0xffff);
          pvVar9 = std::array<wasm::Literal,_8UL>::operator[]
                             ((array<wasm::Literal,_8UL> *)local_3e8,
                              (ulong)(byte)ptrFlow.breakTo.super_IString.str._M_str[0x28]);
          ::wasm::Literal::operator=(pvVar9,&local_400);
          ::wasm::Literal::~Literal(&local_400);
          ::wasm::Literal::Literal(&local_430,(array *)local_3e8);
          Flow::Flow(__return_storage_ptr__,&local_430);
          ::wasm::Literal::~Literal(&local_430);
        }
        else {
          pEVar11 = MemoryInstanceInfo::interface((MemoryInstanceInfo *)local_d8);
          aVar1 = local_110;
          pvVar9 = std::array<wasm::Literal,_8UL>::operator[]
                             ((array<wasm::Literal,_8UL> *)local_3e8,
                              (ulong)(byte)ptrFlow.breakTo.super_IString.str._M_str[0x28]);
          iVar3 = wasm::Literal::geti32(pvVar9);
          lanes_2._M_elems[3].type.id._0_4_ = info.instance._0_4_;
          lanes_2._M_elems[3].type.id._4_4_ = info.instance._4_4_;
          (*pEVar11->_vptr_ExternalInterface[0x17])
                    (pEVar11,aVar1,(ulong)(uint)(int)(short)iVar3,
                     CONCAT44(info.instance._4_4_,info.instance._0_4_),
                     CONCAT44(info.name.super_IString.str._M_len._4_4_,
                              (undefined4)info.name.super_IString.str._M_len));
          Flow::Flow(__return_storage_ptr__);
        }
        std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_3e8);
        break;
      case 2:
      case 6:
        ::wasm::Literal::getLanesI32x4();
        bVar2 = SIMDLoadStoreLane::isLoad
                          ((SIMDLoadStoreLane *)ptrFlow.breakTo.super_IString.str._M_str);
        if (bVar2) {
          pEVar11 = MemoryInstanceInfo::interface((MemoryInstanceInfo *)local_d8);
          local_4c8 = local_110;
          local_4d8 = info.instance._0_4_;
          uStack_4d4 = info.instance._4_4_;
          uStack_4d0 = (undefined4)info.name.super_IString.str._M_len;
          uStack_4cc = info.name.super_IString.str._M_len._4_4_;
          init = (*pEVar11->_vptr_ExternalInterface[0x12])
                           (pEVar11,local_110,CONCAT44(info.instance._4_4_,info.instance._0_4_),
                            CONCAT44(info.name.super_IString.str._M_len._4_4_,
                                     (undefined4)info.name.super_IString.str._M_len));
          wasm::Literal::Literal(&local_4c0,init);
          pvVar10 = std::array<wasm::Literal,_4UL>::operator[]
                              ((array<wasm::Literal,_4UL> *)local_4a8,
                               (ulong)(byte)ptrFlow.breakTo.super_IString.str._M_str[0x28]);
          ::wasm::Literal::operator=(pvVar10,&local_4c0);
          ::wasm::Literal::~Literal(&local_4c0);
          ::wasm::Literal::Literal(&local_4f0,(array *)local_4a8);
          Flow::Flow(__return_storage_ptr__,&local_4f0);
          ::wasm::Literal::~Literal(&local_4f0);
        }
        else {
          pEVar11 = MemoryInstanceInfo::interface((MemoryInstanceInfo *)local_d8);
          aVar1 = local_110;
          pvVar10 = std::array<wasm::Literal,_4UL>::operator[]
                              ((array<wasm::Literal,_4UL> *)local_4a8,
                               (ulong)(byte)ptrFlow.breakTo.super_IString.str._M_str[0x28]);
          uVar4 = wasm::Literal::geti32(pvVar10);
          lanes_3._M_elems[1].type.id._0_4_ = info.instance._0_4_;
          lanes_3._M_elems[1].type.id._4_4_ = info.instance._4_4_;
          (*pEVar11->_vptr_ExternalInterface[0x18])
                    (pEVar11,aVar1,(ulong)uVar4,CONCAT44(info.instance._4_4_,info.instance._0_4_),
                     CONCAT44(info.name.super_IString.str._M_len._4_4_,
                              (undefined4)info.name.super_IString.str._M_len));
          Flow::Flow(__return_storage_ptr__);
        }
        std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_4a8);
        break;
      case 3:
      case 7:
        ::wasm::Literal::getLanesI64x2();
        bVar2 = SIMDLoadStoreLane::isLoad
                          ((SIMDLoadStoreLane *)ptrFlow.breakTo.super_IString.str._M_str);
        if (bVar2) {
          pEVar11 = MemoryInstanceInfo::interface((MemoryInstanceInfo *)local_d8);
          local_558 = local_110;
          local_568 = info.instance._0_4_;
          uStack_564 = info.instance._4_4_;
          uStack_560 = (undefined4)info.name.super_IString.str._M_len;
          uStack_55c = info.name.super_IString.str._M_len._4_4_;
          iVar5 = (*pEVar11->_vptr_ExternalInterface[0x14])
                            (pEVar11,local_110,CONCAT44(info.instance._4_4_,info.instance._0_4_),
                             CONCAT44(info.name.super_IString.str._M_len._4_4_,
                                      (undefined4)info.name.super_IString.str._M_len));
          wasm::Literal::Literal(&local_550,CONCAT44(extraout_var,iVar5));
          pvVar12 = std::array<wasm::Literal,_2UL>::operator[]
                              ((array<wasm::Literal,_2UL> *)local_538,
                               (ulong)(byte)ptrFlow.breakTo.super_IString.str._M_str[0x28]);
          ::wasm::Literal::operator=(pvVar12,&local_550);
          ::wasm::Literal::~Literal(&local_550);
          ::wasm::Literal::Literal(&local_580,(array *)local_538);
          Flow::Flow(__return_storage_ptr__,&local_580);
          ::wasm::Literal::~Literal(&local_580);
        }
        else {
          pEVar11 = MemoryInstanceInfo::interface((MemoryInstanceInfo *)local_d8);
          aVar1 = local_110;
          pvVar12 = std::array<wasm::Literal,_2UL>::operator[]
                              ((array<wasm::Literal,_2UL> *)local_538,
                               (ulong)(byte)ptrFlow.breakTo.super_IString.str._M_str[0x28]);
          iVar13 = wasm::Literal::geti64(pvVar12);
          (*pEVar11->_vptr_ExternalInterface[0x19])
                    (pEVar11,aVar1,iVar13,CONCAT44(info.instance._4_4_,info.instance._0_4_),
                     CONCAT44(info.name.super_IString.str._M_len._4_4_,
                              (undefined4)info.name.super_IString.str._M_len));
          Flow::Flow(__return_storage_ptr__);
        }
        std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_538);
        break;
      default:
        ::wasm::handle_unreachable
                  ("unexpected op",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0xf91);
      }
      ::wasm::Literal::~Literal((Literal *)&lanes._M_elems[0xf].type);
    }
    Flow::~Flow((Flow *)&info.name.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDLoadStoreLane(SIMDLoadStoreLane* curr) {
    NOTE_ENTER("SIMDLoadStoreLane");
    Flow ptrFlow = self()->visit(curr->ptr);
    if (ptrFlow.breaking()) {
      return ptrFlow;
    }
    NOTE_EVAL1(ptrFlow);
    Flow vecFlow = self()->visit(curr->vec);
    if (vecFlow.breaking()) {
      return vecFlow;
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    Address addr = info.instance->getFinalAddress(
      curr, ptrFlow.getSingleValue(), curr->getMemBytes(), memorySize);
    Literal vec = vecFlow.getSingleValue();
    switch (curr->op) {
      case Load8LaneVec128:
      case Store8LaneVec128: {
        std::array<Literal, 16> lanes = vec.getLanesUI8x16();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load8u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store8(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Load16LaneVec128:
      case Store16LaneVec128: {
        std::array<Literal, 8> lanes = vec.getLanesUI16x8();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load16u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store16(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Load32LaneVec128:
      case Store32LaneVec128: {
        std::array<Literal, 4> lanes = vec.getLanesI32x4();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load32u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store32(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Store64LaneVec128:
      case Load64LaneVec128: {
        std::array<Literal, 2> lanes = vec.getLanesI64x2();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load64u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store64(
            addr, lanes[curr->index].geti64(), info.name);
          return {};
        }
      }
    }
    WASM_UNREACHABLE("unexpected op");
  }